

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall
QDockAreaLayout::tabifyDockWidget(QDockAreaLayout *this,QDockWidget *first,QDockWidget *second)

{
  int index;
  QDockAreaLayoutInfo *this_00;
  QLayoutItem *dockWidgetItem;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<int> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf((QList<int> *)&local_48,this,&first->super_QWidget);
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    this_00 = info(this,(QList<int> *)&local_48);
    index = local_48.ptr[(long)(local_48.size + -1)];
    dockWidgetItem = (QLayoutItem *)operator_new(0x18);
    QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)dockWidgetItem,second);
    QDockAreaLayoutInfo::tab(this_00,index,dockWidgetItem);
    QObject::objectName();
    removePlaceHolder(this,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::tabifyDockWidget(QDockWidget *first, QDockWidget *second)
{
    const QList<int> path = indexOf(first);
    if (path.isEmpty())
        return;

    QDockAreaLayoutInfo *info = this->info(path);
    Q_ASSERT(info != nullptr);
    info->tab(path.last(), new QDockWidgetItem(second));

    removePlaceHolder(second->objectName());
}